

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O2

void __thiscall
soplex::SPxBoundFlippingRT<double>::flipAndUpdate(SPxBoundFlippingRT<double> *this,int *nflips)

{
  SSVectorBase<double> *pSVar1;
  SSVectorBase<double> *this_00;
  double dVar2;
  int iVar3;
  int iVar4;
  pointer pBVar5;
  int *piVar6;
  ulong uVar7;
  int iVar8;
  double *pdVar9;
  SPxSolverBase<double> *pSVar10;
  SPxOut *pSVar11;
  Status *pSVar12;
  long lVar13;
  Status SVar14;
  char *t;
  int i;
  long lVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  double dVar19;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity;
  int local_7c;
  double local_78;
  double local_70;
  DataKey local_68;
  double local_60;
  undefined4 local_54;
  DataKey local_50;
  SSVectorBase<double> *local_48;
  int *local_40;
  SSVectorBase<double> *local_38;
  
  pSVar1 = &this->updPrimRhs;
  SSVectorBase<double>::setup(pSVar1);
  SSVectorBase<double>::reDim
            (pSVar1,(((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                     thecovectors->set).thenum);
  this_00 = &this->updPrimVec;
  SSVectorBase<double>::reDim
            (this_00,(((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                      thecovectors->set).thenum);
  local_48 = pSVar1;
  SSVectorBase<double>::clear(pSVar1);
  local_38 = this_00;
  SSVectorBase<double>::clear(this_00);
  lVar16 = 0;
  lVar15 = 0;
  local_7c = 0;
  local_40 = nflips;
  do {
    pSVar1 = local_48;
    iVar3 = *nflips;
    if (iVar3 <= lVar15) {
      *nflips = iVar3 - local_7c;
      if (iVar3 - local_7c != 0 && local_7c <= iVar3) {
        pSVar10 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
        bVar18 = pSVar10->theRep == ROW;
        uVar7 = (ulong)bVar18;
        VectorBase<double>::operator-=((&pSVar10->theFrhs)[(ulong)bVar18 * 2],local_48);
        pSVar10 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
        (&pSVar10->solveVector3)[uVar7 * 4] = local_38;
        (&pSVar10->solveVector3rhs)[uVar7 * 4] = pSVar1;
      }
      return;
    }
    pBVar5 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = *(int *)((long)&pBVar5->idx + lVar16);
    lVar17 = (long)iVar3;
    if (lVar17 < 0) {
      local_7c = local_7c + 1;
    }
    else {
      pSVar10 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
      iVar4 = *(int *)((long)&pBVar5->src + lVar16);
      if (iVar4 == -1) {
        local_50 = (pSVar10->super_SPxBasisBase<double>).theBaseId.data[lVar17].super_DataKey;
        iVar4 = local_7c;
        if (local_50.info < 0) {
          SPxRowId::SPxRowId((SPxRowId *)&local_68,(SPxId *)&local_50);
          iVar8 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                            (&(pSVar10->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                              super_SVSetBase<double>.set,&local_68);
          pSVar12 = (pSVar10->super_SPxBasisBase<double>).thedesc.rowstat.data;
          lVar13 = (long)iVar8;
          SVar14 = pSVar12[lVar13];
          pSVar10 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
          local_78 = (pSVar10->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar13];
          local_70 = (pSVar10->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar13];
          if (SVar14 == P_ON_LOWER) goto LAB_00209edc;
          if (SVar14 == P_ON_UPPER) goto LAB_00209e02;
          pSVar11 = pSVar10->spxout;
          dVar19 = 0.0;
          iVar4 = local_7c + 1;
          if ((pSVar11 != (SPxOut *)0x0) && (0 < (int)pSVar11->m_verbosity)) {
            local_54 = 1;
            local_68.info = pSVar11->m_verbosity;
            (*pSVar11->_vptr_SPxOut[2])(pSVar11,&local_54);
            pSVar11 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                      spxout;
            t = "unexpected basis status: ";
            goto LAB_0020a38d;
          }
        }
        else {
          SPxColId::SPxColId((SPxColId *)&local_68,(SPxId *)&local_50);
          iVar8 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                            (&(pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.
                              super_SVSetBase<double>.set,&local_68);
          pSVar12 = (pSVar10->super_SPxBasisBase<double>).thedesc.colstat.data;
          lVar13 = (long)iVar8;
          SVar14 = pSVar12[lVar13];
          pSVar10 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
          local_78 = (pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar13];
          local_70 = (pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar13];
          if (SVar14 == P_ON_LOWER) {
LAB_00209edc:
            pSVar12[lVar13] = P_ON_UPPER;
            dVar19 = local_70 - local_78;
            (pSVar10->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar17] =
                 -(pSVar10->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar17];
            pdVar9 = (double *)infinity();
            (((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->theUBbound).
            val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar17] = *pdVar9;
          }
          else if (SVar14 == P_ON_UPPER) {
LAB_00209e02:
            pSVar12[lVar13] = P_ON_LOWER;
            dVar19 = local_78 - local_70;
            (pSVar10->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar17] =
                 -(pSVar10->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar17];
            pdVar9 = (double *)infinity();
            (((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->theLBbound).
            val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar17] = -*pdVar9;
          }
          else {
            pSVar11 = pSVar10->spxout;
            dVar19 = 0.0;
            iVar4 = local_7c + 1;
            if ((pSVar11 != (SPxOut *)0x0) && (0 < (int)pSVar11->m_verbosity)) {
              local_54 = 1;
              local_68.info = pSVar11->m_verbosity;
              (*pSVar11->_vptr_SPxOut[2])(pSVar11,&local_54);
              pSVar11 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                        spxout;
              t = "FVEC unexpected status: ";
LAB_0020a38d:
              pSVar11 = soplex::operator<<(pSVar11,t);
              pSVar11 = soplex::operator<<(pSVar11,SVar14);
              pSVar11 = soplex::operator<<(pSVar11," index: ");
              pSVar11 = soplex::operator<<(pSVar11,iVar3);
              pSVar11 = soplex::operator<<(pSVar11," val: ");
              pSVar11 = soplex::operator<<(pSVar11,(((this->super_SPxFastRT<double>).
                                                     super_SPxRatioTester<double>.thesolver)->
                                                    theFvec->super_VectorBase<double>).val.
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar17])
              ;
              pSVar11 = soplex::operator<<(pSVar11," upd: ");
              pSVar11 = soplex::operator<<(pSVar11,(((this->super_SPxFastRT<double>).
                                                     super_SPxRatioTester<double>.thesolver)->
                                                    theFvec->thedelta).super_VectorBase<double>.val.
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar17])
              ;
              pSVar11 = soplex::operator<<(pSVar11," lower: ");
              pSVar11 = soplex::operator<<(pSVar11,local_70);
              pSVar11 = soplex::operator<<(pSVar11," upper: ");
              pSVar11 = soplex::operator<<(pSVar11,local_78);
              pSVar11 = soplex::operator<<(pSVar11," bp.val: ");
              pSVar11 = soplex::operator<<(pSVar11,*(double *)
                                                    ((long)&((this->breakpoints).data.
                                                                                                                          
                                                  super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->val +
                                                  lVar16));
              std::endl<char,std::char_traits<char>>(pSVar11->m_streams[pSVar11->m_verbosity]);
              pSVar11 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                        spxout;
              (*pSVar11->_vptr_SPxOut[2])(pSVar11,&local_68);
              dVar19 = 0.0;
              iVar4 = local_7c + 1;
            }
          }
        }
        local_7c = iVar4;
        piVar6 = (this->updPrimRhs).super_IdxSet.idx;
        iVar4 = (this->updPrimRhs).super_IdxSet.num;
        (this->updPrimRhs).super_IdxSet.num = iVar4 + 1;
        piVar6[iVar4] = iVar3;
        (this->updPrimRhs).super_VectorBase<double>.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar17] = dVar19;
        nflips = local_40;
      }
      else {
        if (iVar4 == 1) {
          pSVar12 = ((pSVar10->super_SPxBasisBase<double>).thedesc.costat)->data;
          SVar14 = pSVar12[lVar17];
          dVar19 = (pSVar10->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar17];
          dVar2 = (pSVar10->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar17];
          if (SVar14 == P_ON_LOWER) {
            pSVar12[lVar17] = P_ON_UPPER;
            dVar19 = dVar19 - dVar2;
            (pSVar10->theCoLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar17] =
                 -(pSVar10->theCoUbound->val).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar17];
            pdVar9 = (double *)infinity();
            pSVar10 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
            (pSVar10->theCoUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar17] = *pdVar9;
            local_78 = (pSVar10->theCoLbound->val).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar17];
LAB_00209ed3:
            local_78 = local_78 * dVar19;
          }
          else {
            if (SVar14 == P_ON_UPPER) {
              pSVar12[lVar17] = P_ON_LOWER;
              local_60 = dVar2 - dVar19;
              dVar19 = (pSVar10->theCoLbound->val).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar17];
              (pSVar10->theCoUbound->val).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar17] =
                   (double)CONCAT44((uint)((ulong)dVar19 >> 0x20) ^ DAT_002ce2e0._4_4_,
                                    SUB84(dVar19,0) ^ (uint)DAT_002ce2e0);
              pdVar9 = (double *)infinity();
              pSVar10 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
              (pSVar10->theCoLbound->val).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar17] = -*pdVar9;
              local_78 = (pSVar10->theCoUbound->val).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar17];
              dVar19 = local_60;
              goto LAB_00209ed3;
            }
            local_7c = local_7c + 1;
            pSVar11 = pSVar10->spxout;
            if ((pSVar11 != (SPxOut *)0x0) && (0 < (int)pSVar11->m_verbosity)) {
              local_50.info = pSVar11->m_verbosity;
              local_68.info = WARNING;
              local_60 = dVar2;
              (*pSVar11->_vptr_SPxOut[2])(pSVar11,&local_68);
              pSVar11 = soplex::operator<<(((this->super_SPxFastRT<double>).
                                            super_SPxRatioTester<double>.thesolver)->spxout,
                                           "COPVEC unexpected status: ");
              pSVar11 = soplex::operator<<(pSVar11,SVar14);
              pSVar11 = soplex::operator<<(pSVar11," index: ");
              pSVar11 = soplex::operator<<(pSVar11,iVar3);
              pSVar11 = soplex::operator<<(pSVar11," val: ");
              pSVar11 = soplex::operator<<(pSVar11,(((this->super_SPxFastRT<double>).
                                                     super_SPxRatioTester<double>.thesolver)->
                                                    theCoPvec->super_VectorBase<double>).val.
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar17])
              ;
              pSVar11 = soplex::operator<<(pSVar11," upd: ");
              pSVar11 = soplex::operator<<(pSVar11,(((this->super_SPxFastRT<double>).
                                                     super_SPxRatioTester<double>.thesolver)->
                                                    theCoPvec->thedelta).super_VectorBase<double>.
                                                   val.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar17])
              ;
              pSVar11 = soplex::operator<<(pSVar11," lower: ");
              pSVar11 = soplex::operator<<(pSVar11,local_60);
              pSVar11 = soplex::operator<<(pSVar11," upper: ");
              pSVar11 = soplex::operator<<(pSVar11,dVar19);
              pSVar11 = soplex::operator<<(pSVar11," bp.val: ");
              pSVar11 = soplex::operator<<(pSVar11,*(double *)
                                                    ((long)&((this->breakpoints).data.
                                                                                                                          
                                                  super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->val +
                                                  lVar16));
              std::endl<char,std::char_traits<char>>(pSVar11->m_streams[pSVar11->m_verbosity]);
              pSVar11 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                        spxout;
              (*pSVar11->_vptr_SPxOut[2])(pSVar11,&local_50);
            }
            dVar19 = 0.0;
            local_78 = 0.0;
          }
          SSVectorBase<double>::setValue
                    (local_48,iVar3,
                     (this->updPrimRhs).super_VectorBase<double>.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar17] - dVar19);
        }
        else {
          if (iVar4 != 0) goto LAB_0020a325;
          pSVar12 = ((pSVar10->super_SPxBasisBase<double>).thedesc.stat)->data;
          SVar14 = pSVar12[lVar17];
          dVar19 = (pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar17];
          dVar2 = (pSVar10->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar17];
          if (SVar14 == P_ON_LOWER) {
            pSVar12[lVar17] = P_ON_UPPER;
            dVar19 = dVar19 - dVar2;
            (pSVar10->theUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar17] =
                 (pSVar10->theLbound->val).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar17];
            pdVar9 = (double *)infinity();
            pSVar10 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
            (pSVar10->theLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar17] = -*pdVar9;
            local_78 = (pSVar10->theUbound->val).super__Vector_base<double,_std::allocator<double>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar17];
LAB_00209fd3:
            local_78 = local_78 * dVar19;
          }
          else {
            if (SVar14 == P_ON_UPPER) {
              pSVar12[lVar17] = P_ON_LOWER;
              local_60 = dVar2 - dVar19;
              (pSVar10->theLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar17] =
                   (pSVar10->theUbound->val).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar17];
              pdVar9 = (double *)infinity();
              pSVar10 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
              (pSVar10->theUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar17] = *pdVar9;
              local_78 = (pSVar10->theLbound->val).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar17];
              dVar19 = local_60;
              goto LAB_00209fd3;
            }
            local_7c = local_7c + 1;
            pSVar11 = pSVar10->spxout;
            if ((pSVar11 != (SPxOut *)0x0) && (0 < (int)pSVar11->m_verbosity)) {
              local_50.info = pSVar11->m_verbosity;
              local_68.info = WARNING;
              local_60 = dVar2;
              (*pSVar11->_vptr_SPxOut[2])(pSVar11,&local_68);
              pSVar11 = soplex::operator<<(((this->super_SPxFastRT<double>).
                                            super_SPxRatioTester<double>.thesolver)->spxout,
                                           "PVEC unexpected status: ");
              pSVar11 = soplex::operator<<(pSVar11,SVar14);
              pSVar11 = soplex::operator<<(pSVar11," index: ");
              pSVar11 = soplex::operator<<(pSVar11,iVar3);
              pSVar11 = soplex::operator<<(pSVar11," val: ");
              pSVar11 = soplex::operator<<(pSVar11,(((this->super_SPxFastRT<double>).
                                                     super_SPxRatioTester<double>.thesolver)->
                                                    thePvec->super_VectorBase<double>).val.
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar17])
              ;
              pSVar11 = soplex::operator<<(pSVar11," upd: ");
              pSVar11 = soplex::operator<<(pSVar11,(((this->super_SPxFastRT<double>).
                                                     super_SPxRatioTester<double>.thesolver)->
                                                    thePvec->thedelta).super_VectorBase<double>.val.
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar17])
              ;
              pSVar11 = soplex::operator<<(pSVar11," lower: ");
              pSVar11 = soplex::operator<<(pSVar11,local_60);
              pSVar11 = soplex::operator<<(pSVar11," upper: ");
              pSVar11 = soplex::operator<<(pSVar11,dVar19);
              pSVar11 = soplex::operator<<(pSVar11," bp.val: ");
              pSVar11 = soplex::operator<<(pSVar11,*(double *)
                                                    ((long)&((this->breakpoints).data.
                                                                                                                          
                                                  super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->val +
                                                  lVar16));
              std::endl<char,std::char_traits<char>>(pSVar11->m_streams[pSVar11->m_verbosity]);
              pSVar11 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                        spxout;
              (*pSVar11->_vptr_SPxOut[2])(pSVar11,&local_50);
              pSVar10 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
            }
            dVar19 = 0.0;
            local_78 = 0.0;
          }
          SSVectorBase<double>::multAdd<double,double>
                    (local_48,dVar19,
                     (SVectorBase<double> *)
                     ((pSVar10->thevectors->set).theitem +
                     (pSVar10->thevectors->set).thekey[lVar17].idx));
        }
        nflips = local_40;
        if ((local_78 != 0.0) || (NAN(local_78))) {
          SPxSolverBase<double>::updateNonbasicValue
                    ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver,local_78
                    );
        }
      }
    }
LAB_0020a325:
    lVar15 = lVar15 + 1;
    lVar16 = lVar16 + 0x10;
  } while( true );
}

Assistant:

void SPxBoundFlippingRT<R>::flipAndUpdate(
   int&                  nflips              /**< number of bounds that should be flipped */
)
{
   assert(nflips > 0);

   // number of bound flips that are not performed
   int skipped;

   updPrimRhs.setup();
   updPrimRhs.reDim(this->thesolver->dim());
   updPrimVec.reDim(this->thesolver->dim());
   updPrimRhs.clear();
   updPrimVec.clear();

   skipped = 0;

   for(int i = 0; i < nflips; ++i)
   {
      int idx;
      idx = breakpoints[i].idx;

      if(idx < 0)
      {
         ++skipped;
         continue;
      }

      R range;
      R upper;
      R lower;
      R objChange = 0.0;
      typename SPxBasisBase<R>::Desc::Status stat;
      typename SPxBasisBase<R>::Desc& ds = this->thesolver->basis().desc();

      range = 0;

      if(breakpoints[i].src == PVEC)
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
         stat = ds.status(idx);
         upper = this->thesolver->upper(idx);
         lower = this->thesolver->lower(idx);

         switch(stat)
         {
         case SPxBasisBase<R>::Desc::P_ON_UPPER :
            ds.status(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            range = lower - upper;
            assert((*this->thesolver->theLbound)[idx] == R(-infinity));
            (*this->thesolver->theLbound)[idx] = (*this->thesolver->theUbound)[idx];
            (*this->thesolver->theUbound)[idx] = R(infinity);
            objChange = range * (*this->thesolver->theLbound)[idx];
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            ds.status(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            range = upper - lower;
            assert((*this->thesolver->theUbound)[idx] == R(infinity));
            (*this->thesolver->theUbound)[idx] = (*this->thesolver->theLbound)[idx];
            (*this->thesolver->theLbound)[idx] = R(-infinity);
            objChange = range * (*this->thesolver->theUbound)[idx];
            break;

         default :
            ++skipped;
            SPX_MSG_WARNING((*this->thesolver->spxout),
                            (*this->thesolver->spxout) << "PVEC unexpected status: " << static_cast<int>(stat)
                            << " index: " << idx
                            << " val: " << this->thesolver->pVec()[idx]
                            << " upd: " << this->thesolver->pVec().delta()[idx]
                            << " lower: " << lower
                            << " upper: " << upper
                            << " bp.val: " << breakpoints[i].val
                            << std::endl;)
         }

         SPxOut::debug(this,
                       "PVEC flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} UCbound: {} LCbound: {}\n",
                       stat, idx, this->thesolver->pVec()[idx], this->thesolver->pVec().delta()[idx], lower, upper,
                       breakpoints[i].val, this->thesolver->theUCbound[idx], this->thesolver->theLCbound[idx]);
         assert(spxAbs(range) < 1e20);
         updPrimRhs.multAdd(range, this->thesolver->vector(idx));

         if(objChange != 0.0)
            this->thesolver->updateNonbasicValue(objChange);
      }
      else if(breakpoints[i].src == COPVEC)
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
         stat = ds.coStatus(idx);
         upper = this->thesolver->rhs(idx);
         lower = this->thesolver->lhs(idx);

         switch(stat)
         {
         case SPxBasisBase<R>::Desc::P_ON_UPPER :
            ds.coStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            range = lower - upper;
            assert((*this->thesolver->theCoUbound)[idx] == R(infinity));
            (*this->thesolver->theCoUbound)[idx] = -(*this->thesolver->theCoLbound)[idx];
            (*this->thesolver->theCoLbound)[idx] = R(-infinity);
            objChange = range * (*this->thesolver->theCoUbound)[idx];
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            ds.coStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            range = upper - lower;
            assert((*this->thesolver->theCoLbound)[idx] == R(-infinity));
            (*this->thesolver->theCoLbound)[idx] = -(*this->thesolver->theCoUbound)[idx];
            (*this->thesolver->theCoUbound)[idx] = R(infinity);
            objChange = range * (*this->thesolver->theCoLbound)[idx];
            break;

         default :
            ++skipped;
            SPX_MSG_WARNING((*this->thesolver->spxout),
                            (*this->thesolver->spxout) << "COPVEC unexpected status: " << static_cast<int>(stat)
                            << " index: " << idx
                            << " val: " << this->thesolver->coPvec()[idx]
                            << " upd: " << this->thesolver->coPvec().delta()[idx]
                            << " lower: " << lower
                            << " upper: " << upper
                            << " bp.val: " << breakpoints[i].val
                            << std::endl;)
         }

         SPxOut::debug(this,
                       "COPVEC flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} URbound: {} LRbound: {}\n",
                       stat, idx, this->thesolver->coPvec()[idx], this->thesolver->coPvec().delta()[idx], lower, upper,
                       breakpoints[i].val, this->thesolver->theURbound[idx], this->thesolver->theLRbound[idx]);
         assert(spxAbs(range) < 1e20);
         updPrimRhs.setValue(idx, updPrimRhs[idx] - range);

         if(objChange != 0.0)
            this->thesolver->updateNonbasicValue(objChange);
      }
      else if(breakpoints[i].src == FVEC)
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::ROW);
         SPxId baseId = this->thesolver->basis().baseId(idx);
         int IdNumber;

         if(baseId.isSPxRowId())
         {
            IdNumber = this->thesolver->number(SPxRowId(baseId));
            stat = ds.rowStatus(IdNumber);
            upper = this->thesolver->rhs(IdNumber);
            lower = this->thesolver->lhs(IdNumber);

            switch(stat)
            {
            case SPxBasisBase<R>::Desc::P_ON_UPPER :
               ds.rowStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               range = upper - lower;
               assert(this->thesolver->theUBbound[idx] == R(infinity));
               this->thesolver->theUBbound[idx] = -this->thesolver->theLBbound[idx];
               this->thesolver->theLBbound[idx] = R(-infinity);
               break;

            case SPxBasisBase<R>::Desc::P_ON_LOWER :
               ds.rowStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               range = lower - upper;
               assert(this->thesolver->theLBbound[idx] == R(-infinity));
               this->thesolver->theLBbound[idx] = -this->thesolver->theUBbound[idx];
               this->thesolver->theUBbound[idx] = R(infinity);
               break;

            default :
               ++skipped;
               SPX_MSG_WARNING((*this->thesolver->spxout),
                               (*this->thesolver->spxout) << "unexpected basis status: " << static_cast<int>(stat)
                               << " index: " << idx
                               << " val: " << this->thesolver->fVec()[idx]
                               << " upd: " << this->thesolver->fVec().delta()[idx]
                               << " lower: " << lower
                               << " upper: " << upper
                               << " bp.val: " << breakpoints[i].val
                               << std::endl;)
            }
         }
         else
         {
            assert(baseId.isSPxColId());
            IdNumber = this->thesolver->number(SPxColId(baseId));
            stat = ds.colStatus(IdNumber);
            upper = this->thesolver->upper(IdNumber);
            lower = this->thesolver->lower(IdNumber);

            switch(stat)
            {
            case SPxBasisBase<R>::Desc::P_ON_UPPER :
               ds.colStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               range = upper - lower;
               assert(this->thesolver->theUBbound[idx] == R(infinity));
               this->thesolver->theUBbound[idx] = -this->thesolver->theLBbound[idx];
               this->thesolver->theLBbound[idx] = R(-infinity);
               break;

            case SPxBasisBase<R>::Desc::P_ON_LOWER :
               ds.colStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               range = lower - upper;
               assert(this->thesolver->theLBbound[idx] == R(-infinity));
               this->thesolver->theLBbound[idx] = -this->thesolver->theUBbound[idx];
               this->thesolver->theUBbound[idx] = R(infinity);
               break;

            default :
               ++skipped;
               SPX_MSG_WARNING((*this->thesolver->spxout),
                               (*this->thesolver->spxout) << "FVEC unexpected status: " << static_cast<int>(stat)
                               << " index: " << idx
                               << " val: " << this->thesolver->fVec()[idx]
                               << " upd: " << this->thesolver->fVec().delta()[idx]
                               << " lower: " << lower
                               << " upper: " << upper
                               << " bp.val: " << breakpoints[i].val
                               << std::endl;)
            }
         }

         SPxOut::debug(this,
                       "basic row/col flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} \n",
                       stat, idx, this->thesolver->fVec()[idx], this->thesolver->fVec().delta()[idx], lower, upper,
                       breakpoints[i].val);
         assert(spxAbs(range) < 1e20);
         assert(updPrimRhs[idx] == 0);
         updPrimRhs.add(idx, range);
      }
   }

   nflips -= skipped;

   if(nflips > 0)
   {
      if(this->thesolver->rep() == SPxSolverBase<R>::ROW)
      {
         assert(this->m_type == SPxSolverBase<R>::ENTER);
         (*this->thesolver->theCoPrhs) -= updPrimRhs;
         this->thesolver->setup4coSolve2(&updPrimVec, &updPrimRhs);
      }
      else
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
         assert(this->m_type == SPxSolverBase<R>::LEAVE);
         (*this->thesolver->theFrhs) -= updPrimRhs;
         this->thesolver->setup4solve2(&updPrimVec, &updPrimRhs);
      }
   }

   return;
}